

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O3

void __thiscall GB::StepPPU_Mode2(GB *this,Tick mode_tick)

{
  u8 *puVar1;
  
  if (mode_tick < 0xa0) {
    if (mode_tick == 0x9f) {
      puVar1 = (this->s).io + 0x41;
      *puVar1 = *puVar1 | 3;
      (this->s).ppu_mode = '\x03';
      (this->s).ppu_mode_start_tick = (this->s).tick + 1;
      (this->s).ppu_window = false;
      (this->s).ppu_line_x = '\0';
      (this->s).ppu_stall = ((this->s).io[0x43] & 7) + 0xe;
    }
    return;
  }
  __assert_fail("mode_tick < 160",
                "/workspace/llm4binary/github/license_all_cmakelists_25/binji[P]gabby/src/gabby.cc",
                0x720,"void GB::StepPPU_Mode2(Tick)");
}

Assistant:

void GB::StepPPU_Mode2(Tick mode_tick) {
  // TODO: sprite stuff
  assert(mode_tick < 160);
  if (mode_tick == 159) {
    SetPPUMode(3);
    s.ppu_window = false;
    s.ppu_line_x = 0;
    s.ppu_stall = 14 + (s.io[SCX] & 7);
  }
}